

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

Index __thiscall
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Jactions,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Jobservations,Scope *agentSope)

{
  Index IVar1;
  const_reference pvVar2;
  reference pvVar3;
  uint in_ESI;
  PlanningUnitMADPDiscrete *in_RDI;
  Index ts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> JAO_Is;
  size_t nrJAO;
  size_t nrJO;
  size_t nrJA;
  LIndex first_JAOHI;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Index in_stack_ffffffffffffff58;
  value_type in_stack_ffffffffffffff5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff60;
  const_reference in_stack_ffffffffffffff68;
  uint local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  long local_48;
  size_t local_40;
  size_t local_38;
  value_type local_30;
  uint local_c;
  
  local_c = in_ESI;
  pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_30 = *pvVar2;
  local_38 = GetNrJointActions((PlanningUnitMADPDiscrete *)0x9d6ee5);
  local_40 = GetNrJointObservations((PlanningUnitMADPDiscrete *)0x9d6ef7);
  local_48 = local_38 * local_40;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9d6f35);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,
             (size_type)in_stack_ffffffffffffff68,(value_type_conflict1 *)in_stack_ffffffffffffff60,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9d6f5a);
  for (local_78 = 0; local_78 < local_c; local_78 = local_78 + 1) {
    in_stack_ffffffffffffff68 =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    in_stack_ffffffffffffff5c = *in_stack_ffffffffffffff68;
    in_stack_ffffffffffffff60 =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    in_stack_ffffffffffffff58 =
         IndexTools::ActionAndObservation_to_ActionObservationIndex
                   (in_stack_ffffffffffffff5c,
                    *(Index *)&(in_stack_ffffffffffffff60->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start,local_38,local_40);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_60,(ulong)local_78);
    *pvVar3 = in_stack_ffffffffffffff58;
  }
  Globals::CastLIndexToIndex(local_30);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_60,0);
  IVar1 = ComputeHistoryIndex(in_RDI,(Index)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                              (Index)in_stack_ffffffffffffff68,(Index *)in_stack_ffffffffffffff60,
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffff60);
  return IVar1;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetJointActionObservationHistoryIndex(
        Index t, 
        const vector<Index>& Jactions,
        const vector<Index>& Jobservations,
        const Scope& agentSope
        ) const
{
    //functioning is the same as for observation histories:
    //(only now the base is the nr AO)

    LIndex first_JAOHI=_m_firstJAOHIforT.at(t);
    size_t nrJA = GetNrJointActions();
    size_t nrJO = GetNrJointObservations();
    size_t nrJAO = nrJA * nrJO;
 
    vector<Index> JAO_Is(t, 0);
    for (Index ts=0; ts<t; ts++)
        JAO_Is[ts] = IndexTools::ActionAndObservation_to_ActionObservationIndex(
                    Jactions.at(ts), Jobservations.at(ts), nrJA, nrJO);
    return( ComputeHistoryIndex(
                t, 
                CastLIndexToIndex(first_JAOHI),
                &JAO_Is[0],
                nrJAO
                )
          );    
}